

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawData::AddDrawList(ImDrawData *this,ImDrawList *draw_list)

{
  ImDrawList *in_RSI;
  ImVector<ImDrawList_*> *in_RDI;
  
  ImDrawList::_PopUnusedDrawCmd(in_RSI);
  ImGui::AddDrawListToDrawDataEx((ImDrawData *)in_RSI,in_RDI,(ImDrawList *)0x227e06);
  return;
}

Assistant:

void ImDrawData::AddDrawList(ImDrawList* draw_list)
{
    IM_ASSERT(CmdLists.Size == CmdListsCount);
    draw_list->_PopUnusedDrawCmd();
    ImGui::AddDrawListToDrawDataEx(this, &CmdLists, draw_list);
}